

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall diy::AMRLink::AMRLink(AMRLink *this)

{
  Bounds<int> BStack_108;
  Bounds<int> local_88;
  
  Bounds<int>::Bounds(&local_88,0);
  Bounds<int>::Bounds(&BStack_108,0);
  AMRLink(this,0,-1,0,&local_88,&BStack_108);
  Bounds<int>::~Bounds(&BStack_108);
  Bounds<int>::~Bounds(&local_88);
  return;
}

Assistant:

AMRLink(): AMRLink(0, -1, 0, Bounds(0), Bounds(0))                      {}